

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O0

void __thiscall ctemplate::SectionTemplateNode::~SectionTemplateNode(SectionTemplateNode *this)

{
  char *pcVar1;
  ulong uVar2;
  bool bVar3;
  ostream *poVar4;
  reference ppTVar5;
  allocator local_69;
  string local_68 [32];
  _Self local_48;
  _Self local_40;
  iterator iter;
  string local_30 [32];
  SectionTemplateNode *local_10;
  SectionTemplateNode *this_local;
  
  (this->super_TemplateNode)._vptr_TemplateNode = (_func_int **)&PTR__SectionTemplateNode_001b50c0;
  local_10 = this;
  if (1 < kVerbosity) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"2: ");
    poVar4 = std::operator<<(poVar4,"Deleting SectionTemplateNode: ");
    pcVar1 = (this->token_).text;
    uVar2 = (this->token_).textlen;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,pcVar1,uVar2,(allocator *)((long)&iter._M_node + 7));
    poVar4 = std::operator<<(poVar4,local_30);
    poVar4 = std::operator<<(poVar4," and its subnodes");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)((long)&iter._M_node + 7));
  }
  local_40._M_node =
       (_List_node_base *)
       std::__cxx11::list<ctemplate::TemplateNode_*,_std::allocator<ctemplate::TemplateNode_*>_>::
       begin(&this->node_list_);
  while( true ) {
    local_48._M_node =
         (_List_node_base *)
         std::__cxx11::list<ctemplate::TemplateNode_*,_std::allocator<ctemplate::TemplateNode_*>_>::
         end(&this->node_list_);
    bVar3 = std::operator!=(&local_40,&local_48);
    if (!bVar3) break;
    ppTVar5 = std::_List_iterator<ctemplate::TemplateNode_*>::operator*(&local_40);
    if (*ppTVar5 != (TemplateNode *)0x0) {
      (*(*ppTVar5)->_vptr_TemplateNode[1])();
    }
    std::_List_iterator<ctemplate::TemplateNode_*>::operator++(&local_40);
  }
  if (1 < kVerbosity) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"2: ");
    poVar4 = std::operator<<(poVar4,"Finished deleting subnodes of SectionTemplateNode: ");
    pcVar1 = (this->token_).text;
    uVar2 = (this->token_).textlen;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,pcVar1,uVar2,&local_69);
    poVar4 = std::operator<<(poVar4,local_68);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
  }
  std::__cxx11::string::~string((string *)&this->indentation_);
  std::__cxx11::list<ctemplate::TemplateNode_*,_std::allocator<ctemplate::TemplateNode_*>_>::~list
            (&this->node_list_);
  TemplateToken::~TemplateToken(&this->token_);
  TemplateNode::~TemplateNode(&this->super_TemplateNode);
  return;
}

Assistant:

SectionTemplateNode::~SectionTemplateNode() {
  VLOG(2) << "Deleting SectionTemplateNode: "
          << string(token_.text, token_.textlen) << " and its subnodes"
          << endl;

  // Need to delete the member of the list because the list is a list
  // of pointers to these instances.
  NodeList::iterator iter = node_list_.begin();
  for (; iter != node_list_.end(); ++iter) {
    delete (*iter);
  }
  VLOG(2) << "Finished deleting subnodes of SectionTemplateNode: "
          << string(token_.text, token_.textlen) << endl;
}